

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O0

reference __thiscall
slang::SmallVectorBase<slang::SourceLocation>::emplace_back<slang::SourceLocation_const&>
          (SmallVectorBase<slang::SourceLocation> *this,SourceLocation *args)

{
  iterator pSVar1;
  SourceLocation *args_local;
  SmallVectorBase<slang::SourceLocation> *this_local;
  
  if (this->len == this->cap) {
    pSVar1 = end(this);
    this_local = (SmallVectorBase<slang::SourceLocation> *)
                 emplaceRealloc<slang::SourceLocation_const&>(this,pSVar1,args);
  }
  else {
    pSVar1 = end(this);
    *pSVar1 = *args;
    this->len = this->len + 1;
    this_local = (SmallVectorBase<slang::SourceLocation> *)back(this);
  }
  return (reference)this_local;
}

Assistant:

reference emplace_back(Args&&... args) {
        if (len == cap)
            return *emplaceRealloc(end(), std::forward<Args>(args)...);

        new (end()) T(std::forward<Args>(args)...);
        len++;
        return back();
    }